

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall LexerTest_LexInfinity_Test::TestBody(LexerTest_LexInfinity_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  _Storage<double,_true> extraout_XMM0_Qa;
  _Storage<double,_true> extraout_XMM0_Qa_00;
  _Storage<double,_true> extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  string local_c18;
  AssertHelper local_bf8;
  Message local_bf0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_be0;
  string_view local_bb8;
  Lexer local_ba8;
  undefined8 local_b50;
  undefined1 local_b48;
  bool local_b39;
  undefined1 local_b38 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_b08;
  Message local_b00 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_af0;
  string_view local_ac8;
  Lexer local_ab8;
  undefined8 local_a5c;
  bool local_a51;
  undefined1 local_a50 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_a20;
  Message local_a18 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a08;
  string_view local_9e0;
  Lexer local_9d0;
  undefined8 local_978;
  undefined1 local_970;
  bool local_961;
  undefined1 local_960 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_930;
  Message local_928 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_918;
  string_view local_8f0;
  Lexer local_8e0;
  undefined8 local_884;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_848;
  Message local_840 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_830;
  string_view local_808;
  Lexer local_7f8;
  undefined8 local_7a0;
  undefined1 local_798;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_758;
  Message local_750 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_740;
  string_view local_718;
  Lexer local_708;
  undefined8 local_6ac;
  bool local_6a1;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_670;
  Message local_668 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_658;
  string_view local_630;
  Lexer local_620;
  undefined8 local_5c8;
  undefined1 local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_580;
  Message local_578 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  string_view local_540;
  Lexer local_530;
  undefined8 local_4d4;
  bool local_4c9;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_;
  Message local_4b0;
  float local_4a8 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  string_view local_478;
  Lexer local_468;
  _Storage<double,_true> local_410;
  undefined1 local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_5;
  Message local_3e8;
  float local_3e0 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d8;
  string_view local_3b0;
  Lexer local_3a0;
  _Optional_payload_base<float> local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_4;
  Message local_328;
  float local_320 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  string_view local_2f0;
  Lexer local_2e0;
  _Storage<double,_true> local_288;
  undefined1 local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_3;
  Message local_260;
  float local_258 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  string_view local_228;
  Lexer local_218;
  _Optional_payload_base<float> local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  Message local_1a0;
  float local_198 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  string_view local_168;
  Lexer local_158;
  _Storage<double,_true> local_100;
  undefined1 local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  float local_d0 [6];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  string_view local_90;
  Lexer local_80;
  _Optional_payload_base<float> local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  LexerTest_LexInfinity_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_90 = sv("inf",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_80,local_90,&local_b8);
  local_28 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_d0[0] = INFINITY;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_20,"Lexer(\"inf\"sv).takeF32()","(__builtin_inff ())",
             (optional<float> *)&local_28,local_d0);
  ::wasm::WATParser::Lexer::~Lexer(&local_80);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_168 = sv("inf",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_158,local_168,&local_190);
  local_f8 = ::wasm::WATParser::Lexer::takeF64();
  local_198[0] = INFINITY;
  local_100 = extraout_XMM0_Qa;
  testing::internal::EqHelper::Compare<std::optional<double>,_float,_nullptr>
            ((EqHelper *)local_f0,"Lexer(\"inf\"sv).takeF64()","(__builtin_inff ())",
             (optional<double> *)&local_100,local_198);
  ::wasm::WATParser::Lexer::~Lexer(&local_158);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_228 = sv("+inf",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_218,local_228,&local_250);
  local_1c0 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_258[0] = INFINITY;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_1b8,"Lexer(\"+inf\"sv).takeF32()","(__builtin_inff ())",
             (optional<float> *)&local_1c0,local_258);
  ::wasm::WATParser::Lexer::~Lexer(&local_218);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2aa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  local_2f0 = sv("+inf",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_2e0,local_2f0,&local_318);
  local_280 = ::wasm::WATParser::Lexer::takeF64();
  local_320[0] = INFINITY;
  local_288 = extraout_XMM0_Qa_00;
  testing::internal::EqHelper::Compare<std::optional<double>,_float,_nullptr>
            ((EqHelper *)local_278,"Lexer(\"+inf\"sv).takeF64()","(__builtin_inff ())",
             (optional<double> *)&local_288,local_320);
  ::wasm::WATParser::Lexer::~Lexer(&local_2e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_3b0 = sv("-inf",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_3a0,local_3b0,&local_3d8);
  local_348 = (_Optional_payload_base<float>)::wasm::WATParser::Lexer::takeF32();
  local_3e0[0] = -INFINITY;
  testing::internal::EqHelper::Compare<std::optional<float>,_float,_nullptr>
            ((EqHelper *)local_340,"Lexer(\"-inf\"sv).takeF32()","-(__builtin_inff ())",
             (optional<float> *)&local_348,local_3e0);
  ::wasm::WATParser::Lexer::~Lexer(&local_3a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_478 = sv("-inf",4);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_468,local_478,&local_4a0);
  local_408 = ::wasm::WATParser::Lexer::takeF64();
  local_4a8[0] = -INFINITY;
  local_410 = extraout_XMM0_Qa_01;
  testing::internal::EqHelper::Compare<std::optional<double>,_float,_nullptr>
            ((EqHelper *)local_400,"Lexer(\"-inf\"sv).takeF64()","-(__builtin_inff ())",
             (optional<double> *)&local_410,local_4a8);
  ::wasm::WATParser::Lexer::~Lexer(&local_468);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_4a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  local_540 = sv("infjunk",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_530,local_540,&local_568);
  local_4d4 = ::wasm::WATParser::Lexer::takeF32();
  local_4c9 = std::optional::operator_cast_to_bool((optional *)&local_4d4);
  local_4c9 = !local_4c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c8,&local_4c9,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_530);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_568);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar1) {
    testing::Message::Message(local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_4c8,
               (AssertionResult *)"Lexer(\"infjunk\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_580,local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  local_630 = sv("infjunk",7);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_620,local_630,&local_658);
  local_5c0 = ::wasm::WATParser::Lexer::takeF64();
  local_5c8 = extraout_XMM0_Qa_02;
  local_5b1 = std::optional::operator_cast_to_bool((optional *)&local_5c8);
  local_5b1 = !local_5b1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_620);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_658);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(local_668);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_5b0,
               (AssertionResult *)"Lexer(\"infjunk\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_670,local_668);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  local_718 = sv("Inf",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_708,local_718,&local_740);
  local_6ac = ::wasm::WATParser::Lexer::takeF32();
  local_6a1 = std::optional::operator_cast_to_bool((optional *)&local_6ac);
  local_6a1 = !local_6a1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a0,&local_6a1,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_708);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
  if (!bVar1) {
    testing::Message::Message(local_750);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_6a0,
               (AssertionResult *)"Lexer(\"Inf\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_758,local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
  local_808 = sv("Inf",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_7f8,local_808,&local_830);
  local_798 = ::wasm::WATParser::Lexer::takeF64();
  local_7a0 = extraout_XMM0_Qa_03;
  local_789 = std::optional::operator_cast_to_bool((optional *)&local_7a0);
  local_789 = !local_789;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_788,&local_789,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_7f8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_830);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(local_840);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_788,
               (AssertionResult *)"Lexer(\"Inf\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_848,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_848,local_840);
    testing::internal::AssertHelper::~AssertHelper(&local_848);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  local_8f0 = sv("INF",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_8e0,local_8f0,&local_918);
  local_884 = ::wasm::WATParser::Lexer::takeF32();
  local_879 = std::optional::operator_cast_to_bool((optional *)&local_884);
  local_879 = !local_879;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_878,&local_879,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_8e0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_918);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
  if (!bVar1) {
    testing::Message::Message(local_928);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_878,
               (AssertionResult *)"Lexer(\"INF\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_930,local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
  local_9e0 = sv("INF",3);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_9d0,local_9e0,&local_a08);
  local_970 = ::wasm::WATParser::Lexer::takeF64();
  local_978 = extraout_XMM0_Qa_04;
  local_961 = std::optional::operator_cast_to_bool((optional *)&local_978);
  local_961 = !local_961;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_960,&local_961,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_9d0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_960);
  if (!bVar1) {
    testing::Message::Message(local_a18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_960,
               (AssertionResult *)"Lexer(\"INF\"sv).takeF64()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a20,local_a18);
    testing::internal::AssertHelper::~AssertHelper(&local_a20);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(local_a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_960);
  local_ac8 = sv("infinity",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ab8,local_ac8,&local_af0);
  local_a5c = ::wasm::WATParser::Lexer::takeF32();
  local_a51 = std::optional::operator_cast_to_bool((optional *)&local_a5c);
  local_a51 = !local_a51;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a50,&local_a51,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_ab8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_af0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a50);
  if (!bVar1) {
    testing::Message::Message(local_b00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_a50,
               (AssertionResult *)"Lexer(\"infinity\"sv).takeF32()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2b9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b08,local_b00);
    testing::internal::AssertHelper::~AssertHelper(&local_b08);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(local_b00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a50);
  local_bb8 = sv("infinity",8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  ::wasm::WATParser::Lexer::Lexer(&local_ba8,local_bb8,&local_be0);
  local_b48 = ::wasm::WATParser::Lexer::takeF64();
  local_b50 = extraout_XMM0_Qa_05;
  local_b39 = std::optional::operator_cast_to_bool((optional *)&local_b50);
  local_b39 = !local_b39;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b38,&local_b39,(type *)0x0);
  ::wasm::WATParser::Lexer::~Lexer(&local_ba8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_be0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b38);
  if (!bVar1) {
    testing::Message::Message(local_bf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c18,(internal *)local_b38,(AssertionResult *)"Lexer(\"infinity\"sv).takeF64()"
               ,"true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2ba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_bf8,local_bf0);
    testing::internal::AssertHelper::~AssertHelper(&local_bf8);
    std::__cxx11::string::~string((string *)&local_c18);
    testing::Message::~Message(local_bf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b38);
  return;
}

Assistant:

TEST(LexerTest, LexInfinity) {
  EXPECT_EQ(Lexer("inf"sv).takeF32(), INFINITY);
  EXPECT_EQ(Lexer("inf"sv).takeF64(), INFINITY);

  EXPECT_EQ(Lexer("+inf"sv).takeF32(), INFINITY);
  EXPECT_EQ(Lexer("+inf"sv).takeF64(), INFINITY);

  EXPECT_EQ(Lexer("-inf"sv).takeF32(), -INFINITY);
  EXPECT_EQ(Lexer("-inf"sv).takeF64(), -INFINITY);

  EXPECT_FALSE(Lexer("infjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("infjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("Inf"sv).takeF32());
  EXPECT_FALSE(Lexer("Inf"sv).takeF64());

  EXPECT_FALSE(Lexer("INF"sv).takeF32());
  EXPECT_FALSE(Lexer("INF"sv).takeF64());

  EXPECT_FALSE(Lexer("infinity"sv).takeF32());
  EXPECT_FALSE(Lexer("infinity"sv).takeF64());
}